

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_gla::build_graph(test_gla *this,ggml_context *ctx)

{
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  undefined8 in_RSI;
  long in_RDI;
  double dVar3;
  ggml_tensor *out;
  ggml_tensor *s;
  ggml_tensor *g;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *q;
  int64_t n_tokens;
  int64_t *in_stack_fffffffffffffd78;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffd80;
  ggml_tensor *pgVar4;
  ggml_context *in_stack_fffffffffffffd88;
  ggml_tensor *pgVar5;
  test_case *in_stack_fffffffffffffd90;
  ggml_tensor *pgVar6;
  allocator_type *in_stack_fffffffffffffd98;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 uVar7;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 uVar8;
  long local_1a8;
  undefined8 local_1a0;
  long *local_198;
  undefined8 local_190;
  ggml_tensor *local_170;
  undefined8 local_160;
  undefined8 local_158;
  long local_150;
  undefined8 *local_148;
  undefined8 local_140;
  ggml_tensor *local_120;
  undefined8 local_110;
  undefined8 local_108;
  long local_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  ggml_tensor *local_d0;
  undefined8 local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  ggml_tensor *local_80;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  undefined8 *local_48;
  undefined8 local_40;
  ggml_tensor *local_20;
  long local_18;
  undefined8 local_10;
  
  local_50 = *(long *)(in_RDI + 0x50) * *(long *)(in_RDI + 0x58);
  local_60 = *(undefined8 *)(in_RDI + 0x48);
  local_58 = *(undefined8 *)(in_RDI + 0x40);
  local_48 = &local_60;
  local_40 = 3;
  local_18 = local_50;
  local_10 = in_RSI;
  std::allocator<long>::allocator((allocator<long> *)0x199d1e);
  __l._M_len._0_4_ = in_stack_fffffffffffffdb0;
  __l._M_array = (iterator)in_stack_fffffffffffffda8;
  __l._M_len._4_4_ = in_stack_fffffffffffffdb4;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffda0,__l,in_stack_fffffffffffffd98);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x199d52);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                      (ggml_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                      (int)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<long>::~allocator((allocator<long> *)0x199d9a);
  local_c0 = *(undefined8 *)(in_RDI + 0x48);
  local_b8 = *(undefined8 *)(in_RDI + 0x40);
  local_b0 = local_18;
  local_a8 = &local_c0;
  local_a0 = 3;
  local_20 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x199e25);
  __l_00._M_len._0_4_ = in_stack_fffffffffffffdb0;
  __l_00._M_array = (iterator)in_stack_fffffffffffffda8;
  __l_00._M_len._4_4_ = in_stack_fffffffffffffdb4;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffda0,__l_00,in_stack_fffffffffffffd98);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x199e59);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                      (ggml_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                      (int)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<long>::~allocator((allocator<long> *)0x199ea1);
  local_110 = *(undefined8 *)(in_RDI + 0x48);
  local_108 = *(undefined8 *)(in_RDI + 0x40);
  local_100 = local_18;
  local_f8 = &local_110;
  local_f0 = 3;
  local_80 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x199f2c);
  __l_01._M_len._0_4_ = in_stack_fffffffffffffdb0;
  __l_01._M_array = (iterator)in_stack_fffffffffffffda8;
  __l_01._M_len._4_4_ = in_stack_fffffffffffffdb4;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffda0,__l_01,in_stack_fffffffffffffd98);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x199f60);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                      (ggml_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                      (int)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<long>::~allocator((allocator<long> *)0x199fa5);
  local_160 = *(undefined8 *)(in_RDI + 0x48);
  local_158 = *(undefined8 *)(in_RDI + 0x40);
  local_150 = local_18;
  local_148 = &local_160;
  local_140 = 3;
  local_d0 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x19a024);
  __l_02._M_len._0_4_ = in_stack_fffffffffffffdb0;
  __l_02._M_array = (iterator)in_stack_fffffffffffffda8;
  __l_02._M_len._4_4_ = in_stack_fffffffffffffdb4;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffda0,__l_02,in_stack_fffffffffffffd98);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x19a055);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                      (ggml_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                      (int)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<long>::~allocator((allocator<long> *)0x19a094);
  uVar8 = *(undefined4 *)(in_RDI + 0x38);
  local_1a8 = *(long *)(in_RDI + 0x48) * *(long *)(in_RDI + 0x48) * *(long *)(in_RDI + 0x40);
  local_1a0 = *(undefined8 *)(in_RDI + 0x58);
  local_198 = &local_1a8;
  local_190 = 2;
  uVar7 = local_10;
  local_120 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x19a10f);
  __l_03._M_len._0_4_ = in_stack_fffffffffffffdb0;
  __l_03._M_array = (iterator)uVar7;
  __l_03._M_len._4_4_ = uVar8;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffda0,__l_03,in_stack_fffffffffffffd98);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x19a140);
  pgVar2 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                      (ggml_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                      (int)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd80);
  std::allocator<long>::~allocator((allocator<long> *)0x19a17f);
  pgVar1 = local_80;
  pgVar4 = local_d0;
  pgVar5 = local_20;
  pgVar6 = local_120;
  local_170 = pgVar2;
  dVar3 = pow((double)*(long *)(in_RDI + 0x48),-0.5);
  pgVar1 = (ggml_tensor *)
           ggml_gated_linear_attn((float)dVar3,local_10,pgVar1,pgVar4,pgVar5,pgVar6,pgVar2);
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        const int64_t n_tokens = n_seq_tokens * n_seqs;
        ggml_tensor * q   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * k   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * v   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * g   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * s   = ggml_new_tensor(ctx, type, 2, std::vector<int64_t>{ head_size * head_size * head_count, n_seqs }.data());
        ggml_tensor * out = ggml_gated_linear_attn(ctx, k, v, q, g, s, pow(head_size, -0.5));
        return out;
    }